

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_uint64
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  long lVar1;
  
  do {
    switch((byte)(this->field_0).json_const_pointer_ & 0xf) {
    case 2:
      lVar1 = as_integer<long>(this);
      return -1 < lVar1;
    case 3:
      return true;
    default:
      return false;
    case 8:
    case 9:
      this = *(basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> **)
              ((long)&this->field_0 + 8);
    }
  } while( true );
}

Assistant:

bool is_uint64() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::uint64:
                    return true;
                case json_storage_kind::int64:
                    return as_integer<int64_t>() >= 0;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_uint64();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_uint64();
                default:
                    return false;
            }
        }